

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

var __thiscall cs::runtime_type::parse_pair(runtime_type *this,var *a,var *b)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined *puVar3;
  runtime_error *this_00;
  long *in_RCX;
  any local_50;
  any local_48;
  any local_40;
  string local_38;
  
  if (b->mDat == (proxy *)0x0) {
    puVar3 = &void::typeinfo;
  }
  else {
    iVar2 = (*b->mDat->data->_vptr_baseHolder[2])();
    puVar3 = (undefined *)CONCAT44(extraout_var,iVar2);
  }
  pcVar1 = *(char **)(puVar3 + 8);
  if (pcVar1 != "St4pairIN7cs_impl3anyES1_E") {
    if (*pcVar1 != '*') {
      iVar2 = strcmp(pcVar1,"St4pairIN7cs_impl3anyES1_E");
      if (iVar2 == 0) goto LAB_00161cd1;
    }
    if (*in_RCX == 0) {
      puVar3 = &void::typeinfo;
    }
    else {
      puVar3 = (undefined *)(**(code **)(**(long **)(*in_RCX + 0x10) + 0x10))();
    }
    pcVar1 = *(char **)(puVar3 + 8);
    if (pcVar1 != "St4pairIN7cs_impl3anyES1_E") {
      if (*pcVar1 != '*') {
        iVar2 = strcmp(pcVar1,"St4pairIN7cs_impl3anyES1_E");
        if (iVar2 == 0) goto LAB_00161cd1;
      }
      local_40.mDat = b->mDat;
      if (local_40.mDat != (proxy *)0x0) {
        (local_40.mDat)->refcount = (local_40.mDat)->refcount + 1;
      }
      copy((EVP_PKEY_CTX *)&local_38,(EVP_PKEY_CTX *)&local_40);
      local_48.mDat = (proxy *)*in_RCX;
      if (local_48.mDat != (proxy *)0x0) {
        (local_48.mDat)->refcount = (local_48.mDat)->refcount + 1;
      }
      copy((EVP_PKEY_CTX *)&local_50,(EVP_PKEY_CTX *)&local_48);
      cs_impl::any::make<std::pair<cs_impl::any,cs_impl::any>,cs_impl::any,cs_impl::any>
                ((any *)this,(any *)&local_38,&local_50);
      cs_impl::any::recycle(&local_50);
      cs_impl::any::recycle(&local_48);
      cs_impl::any::recycle((any *)&local_38);
      cs_impl::any::recycle(&local_40);
      return (var)(proxy *)this;
    }
  }
LAB_00161cd1:
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Unsupported operator operations(Pair).","");
  runtime_error::runtime_error(this_00,&local_38);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var runtime_type::parse_pair(const var &a, const var &b)
	{
		if (a.type() != typeid(pair) && b.type() != typeid(pair))
			return var::make<pair>(copy(a), copy(b));
		else
			throw runtime_error("Unsupported operator operations(Pair).");
	}